

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

string * __thiscall
leveldb::Harness::ToString
          (string *__return_storage_ptr__,Harness *this,KVMap *data,const_iterator *it)

{
  Comparator *pCVar1;
  long lVar2;
  long *plVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  long *plVar5;
  size_type *psVar6;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pCVar1 = (data->_M_t)._M_impl.
           super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>._M_key_compare.
           cmp;
  if (pCVar1 != (Comparator *)&(this->options_).create_if_missing) {
    std::operator+(&local_38,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pCVar1 + 4)
                  );
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,
                                (ulong)(data->_M_t)._M_impl.
                                       super__Rb_tree_key_compare<leveldb::(anonymous_namespace)::STLLessThan>
                                       ._M_key_compare.cmp[8]._vptr_Comparator);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_48 = *plVar5;
      lStack_40 = plVar3[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar5;
      local_58 = (long *)*plVar3;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    psVar4 = (string *)&local_38.field_2;
    if ((string *)local_38._M_dataplus._M_p != psVar4) {
      operator_delete(local_38._M_dataplus._M_p);
      psVar4 = extraout_RAX_00;
    }
    return psVar4;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"END","");
  return extraout_RAX;
}

Assistant:

std::string ToString(const KVMap& data, const KVMap::const_iterator& it) {
    if (it == data.end()) {
      return "END";
    } else {
      return "'" + it->first + "->" + it->second + "'";
    }
  }